

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O1

SDKJsonResult * __thiscall
tonk::SDKSocket::Connect
          (SDKJsonResult *__return_storage_ptr__,SDKSocket *this,SDKConnection *sdkConnection,
          string *hostname,uint16_t port)

{
  char *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  TonkConnectionConfig TVar2;
  SDKConnection *pSVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TonkResult TVar5;
  TonkJson errorJson;
  SDKConnection *local_458;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_450;
  code *pcStack_448;
  code *pcStack_440;
  code *local_438;
  TonkJson local_428;
  
  p_Stack_450 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  pcStack_448 = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  pcStack_440 = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  local_438 = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  local_458 = sdkConnection;
  if (fp_tonk_connect == (fp_tonk_connect_t)0x0) {
    sdkConnection->MyConnection = (TonkConnection)0x0;
    memset(&local_428,0,0x400);
    TVar5 = Tonk_DLL_Not_Found;
  }
  else {
    TVar2.OnConnect = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
    TVar2.AppContextPtr = sdkConnection;
    TVar2.OnData = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
    TVar2.OnTick = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
    TVar2.OnClose = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
    TVar5 = (*fp_tonk_connect)(this->MySocket,TVar2,(hostname->_M_dataplus)._M_p,port,
                               &sdkConnection->MyConnection,&local_428);
  }
  (__return_storage_ptr__->super_SDKResult).Result = Tonk_Success;
  (__return_storage_ptr__->ErrorJson)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ErrorJson).field_2;
  (__return_storage_ptr__->ErrorJson)._M_string_length = 0;
  (__return_storage_ptr__->ErrorJson).field_2._M_local_buf[0] = '\0';
  if (TVar5 == Tonk_Success) {
    std::__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tonk::SDKConnection,void>
              ((__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2> *)&local_458,
               (__weak_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2> *)
               &sdkConnection->super_enable_shared_from_this<tonk::SDKConnection>);
    p_Var4 = p_Stack_450;
    pSVar3 = local_458;
    local_458 = (SDKConnection *)0x0;
    p_Stack_450 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (sdkConnection->SelfReference).
              super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (sdkConnection->SelfReference).
    super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pSVar3;
    (sdkConnection->SelfReference).
    super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_450 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_450);
    }
  }
  else {
    (__return_storage_ptr__->super_SDKResult).Result = TVar5;
    pcVar1 = (char *)(__return_storage_ptr__->ErrorJson)._M_string_length;
    strlen(local_428.JsonString);
    std::__cxx11::string::_M_replace
              ((ulong)&__return_storage_ptr__->ErrorJson,0,pcVar1,(ulong)&local_428);
  }
  return __return_storage_ptr__;
}

Assistant:

SDKJsonResult SDKSocket::Connect(
    SDKConnection* sdkConnection,
    const std::string& hostname, ///< [in] Hostname of the remote host
    uint16_t port ///< [in] Port for the remote host
)
{
    TonkConnectionConfig config = MakeConnectionConfig(sdkConnection);

    TonkJson errorJson;
    TonkResult result = tonk_connect(
        MySocket,
        config,
        hostname.c_str(),
        port,
        &sdkConnection->MyConnection,
        &errorJson);

    SDKJsonResult error;
    if (TONK_FAILED(result))
    {
        error.Result = result;
        error.ErrorJson = errorJson.JsonString;
    }
    else
    {
        // Hold a self-reference if connection is started
        sdkConnection->SelfReference = sdkConnection->shared_from_this();
    }
    return error;
}